

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

string * hashToDir(string *hash_code)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [55];
  allocator local_19 [9];
  string *hash_code_local;
  
  hash_code_local = hash_code;
  bVar1 = std::operator==(in_RSI,"Stage");
  if (bVar1) {
    std::__cxx11::string::string((string *)hash_code,(string *)STAGE_DIR_abi_cxx11_);
  }
  else {
    bVar1 = std::operator==(in_RSI,"Work");
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)hash_code,".",local_19);
      std::allocator<char>::~allocator((allocator<char> *)local_19);
    }
    else {
      std::operator+(local_50,COMMITS_DIR_abi_cxx11_);
      std::operator+(hash_code,local_50);
      std::__cxx11::string::~string((string *)local_50);
    }
  }
  return hash_code;
}

Assistant:

String hashToDir(String hash_code){
    if(hash_code == "Stage"){
        return STAGE_DIR;
    }
    if(hash_code == "Work"){
        return ".";
    }
    return COMMITS_DIR + "/" + hash_code;
}